

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<true>::PushElement<unsigned_int,unsigned_int>
          (FlatBufferBuilderImpl<true> *this,uint element)

{
  type tVar1;
  uint local_18;
  uint local_14;
  FlatBufferBuilderImpl<true> *pFStack_10;
  uint element_local;
  FlatBufferBuilderImpl<true> *this_local;
  
  local_14 = element;
  pFStack_10 = this;
  AssertScalarT<unsigned_int>(this);
  Align(this,4);
  local_18 = EndianScalar<unsigned_int>(local_14);
  vector_downward<unsigned_long>::push_small<unsigned_int>(&this->buf_,&local_18);
  tVar1 = CalculateOffset<unsigned_int>(this);
  return tVar1;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }